

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

size_t ckh_isearch(ckh_t *ckh,void *key)

{
  void *pvVar1;
  _Bool _Var2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t hashes [2];
  ulong local_38;
  ulong local_30;
  
  (*ckh->hash)(key,&local_38);
  local_38 = ~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & local_38;
  lVar5 = local_38 * 4;
  lVar3 = local_38 << 6;
  lVar6 = 0;
  while ((pvVar1 = *(void **)((long)&ckh->tab->key + lVar3), pvVar1 == (void *)0x0 ||
         (_Var2 = (*ckh->keycomp)(key,pvVar1), !_Var2))) {
    lVar6 = lVar6 + -1;
    lVar3 = lVar3 + 0x10;
    if (lVar6 == -4) {
LAB_01d8260b:
      uVar4 = ~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & local_30;
      lVar5 = uVar4 << 6;
      lVar3 = 0;
      while ((pvVar1 = *(void **)((long)&ckh->tab->key + lVar5), pvVar1 == (void *)0x0 ||
             (_Var2 = (*ckh->keycomp)(key,pvVar1), !_Var2))) {
        lVar3 = lVar3 + 1;
        lVar5 = lVar5 + 0x10;
        if (lVar3 == 4) {
          return 0xffffffffffffffff;
        }
      }
      return uVar4 * 4 + lVar3;
    }
  }
  if (lVar5 + 1 != lVar6) {
    return lVar5 - lVar6;
  }
  goto LAB_01d8260b;
}

Assistant:

static size_t
ckh_isearch(ckh_t *ckh, const void *key) {
	size_t hashes[2], bucket, cell;

	assert(ckh != NULL);

	ckh->hash(key, hashes);

	/* Search primary bucket. */
	bucket = hashes[0] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	cell = ckh_bucket_search(ckh, bucket, key);
	if (cell != SIZE_T_MAX) {
		return cell;
	}

	/* Search secondary bucket. */
	bucket = hashes[1] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	cell = ckh_bucket_search(ckh, bucket, key);
	return cell;
}